

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O3

void __thiscall DFsScript::ClearSections(DFsScript *this)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar1;
  int i;
  long lVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar3;
  
  lVar2 = 0;
  do {
    aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)this->sections[lVar2].field_0.p;
    if ((aVar1 != (DFsSection *)0x0) && ((*(byte *)((long)aVar1 + 0x20) & 0x20) == 0)) {
      do {
        aVar3 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)((aVar1.p)->next).field_0.p;
        if (aVar3.p == (DFsSection *)0x0) {
LAB_0050fb25:
          aVar3.p = (DFsSection *)0x0;
        }
        else if ((((aVar3.p)->super_DObject).ObjectFlags & 0x20) != 0) {
          ((aVar1.p)->next).field_0.p = (DFsSection *)0x0;
          goto LAB_0050fb25;
        }
        (*((aVar1.p)->super_DObject)._vptr_DObject[4])();
        aVar1 = aVar3;
      } while (aVar3.p != (DFsSection *)0x0);
    }
    this->sections[lVar2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x11) {
      return;
    }
  } while( true );
}

Assistant:

void DFsScript::ClearSections()
{
	for(int i=0;i<SECTIONSLOTS;i++)
	{
		DFsSection * var = sections[i];
		while(var)
		{
			DFsSection *next = var->next;
			var->Destroy();
			var = next;
		}
		sections[i] = NULL;
	}
}